

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DGXMLScanner::scanCDSection(DGXMLScanner *this)

{
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  StackElem *pSVar5;
  UnexpectedEOFException *this_00;
  XMLReader *pXVar6;
  XMLCh *pXVar7;
  XMLSize_t XVar8;
  XMLCh local_58 [4];
  XMLCh tmpBuf [9];
  XMLCh nextCh;
  CharDataOpts charOpts;
  StackElem *topElem;
  undefined1 local_20 [6];
  bool gotLeadingSurrogate;
  bool emittedError;
  XMLBufBid bbCData;
  DGXMLScanner *this_local;
  
  bbCData.fMgr = (XMLBufferMgr *)this;
  bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'[');
  if (!bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'[');
    if (!bVar3) {
      return;
    }
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_20,&(this->super_XMLScanner).fBufMgr);
  bVar2 = false;
  bVar3 = false;
  pSVar5 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
  register0x00000000 = (*(pSVar5->fThisElement->super_XSerializable)._vptr_XSerializable[6])();
  while( true ) {
    tmpBuf[7] = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    if (tmpBuf[7] == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0xbd7,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,
                  UnexpectedEOFException::~UnexpectedEOFException);
    }
    if ((((this->super_XMLScanner).fValidate & 1U) != 0) &&
       (((this->super_XMLScanner).fStandalone & 1U) != 0)) {
      pXVar6 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar4 = XMLReader::isWhitespace(pXVar6,tmpBuf[7]);
      if ((bVar4) &&
         ((bVar4 = XMLElementDecl::isExternal(pSVar5->fThisElement), bVar4 &&
          (stack0xffffffffffffffc0 == 1)))) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
      }
    }
    if ((tmpBuf[7] == L']') &&
       (bVar4 = ReaderMgr::skippedString(&(this->super_XMLScanner).fReaderMgr,L"]>"), bVar4)) break;
    if (!bVar2) {
      if (((ushort)tmpBuf[7] < 0xd800) || (0xdbff < (ushort)tmpBuf[7])) {
        if (((ushort)tmpBuf[7] < 0xdc00) || (0xdfff < (ushort)tmpBuf[7])) {
          if (bVar3) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          else {
            pXVar6 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
            bVar3 = XMLReader::isXMLChar(pXVar6,tmpBuf[7]);
            if (!bVar3) {
              XMLString::binToText
                        ((uint)(ushort)tmpBuf[7],local_58,8,0x10,
                         (this->super_XMLScanner).fMemoryManager);
              XMLScanner::emitError
                        (&this->super_XMLScanner,InvalidCharacter,local_58,(XMLCh *)0x0,(XMLCh *)0x0
                         ,(XMLCh *)0x0);
              bVar2 = true;
            }
          }
        }
        else if (!bVar3) {
          XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
        }
        bVar3 = false;
      }
      else if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      else {
        bVar3 = true;
      }
    }
    XMLBufBid::append((XMLBufBid *)local_20,tmpBuf[7]);
  }
  if (bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
  }
  if ((((this->super_XMLScanner).fValidate & 1U) != 0) && (stack0xffffffffffffffc0 != 2)) {
    XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    pXVar1 = (this->super_XMLScanner).fDocHandler;
    pXVar7 = XMLBufBid::getRawBuffer((XMLBufBid *)local_20);
    XVar8 = XMLBufBid::getLen((XMLBufBid *)local_20);
    (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,pXVar7,XVar8,1);
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_20);
  return;
}

Assistant:

void DGXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool     gotLeadingSurrogate = false;

    // Get the character data opts for the current element
    const ElemStack::StackElem* topElem = fElemStack.topElement();
    XMLElementDecl::CharDataOpts charOpts =  topElem->fThisElement->getCharDataOpts();

    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        if (fValidate && fStandalone && (fReaderMgr.getCurrentReader()->isWhitespace(nextCh)))
        {
            // This document is standalone; this ignorable CDATA whitespace is forbidden.
            // XML 1.0, Section 2.9
            // And see if the current element is a 'Children' style content model
            if (topElem->fThisElement->isExternal()) {

                if (charOpts == XMLElementDecl::SpacesOk) // Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                }
            }
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate)
                emitError(XMLErrs::Expected2ndSurrogateChar);

            if (fValidate) {

                if (charOpts != XMLElementDecl::AllCharData)
                {
                    // They definitely cannot handle any type of char data
                    fValidator->emitError(XMLValid::NoCharDataInCM);
                }
            }

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                fDocHandler->docCharacters
                    (
                    bbCData.getRawBuffer()
                    , bbCData.getLen()
                    , true
                    );
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}